

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_iterator.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_iterator<asio::ip::tcp>::increment
          (basic_resolver_iterator<asio::ip::tcp> *this)

{
  size_type sVar1;
  element_type *this_00;
  size_type sVar2;
  long in_RDI;
  __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *unaff_retaddr;
  
  sVar1 = *(long *)(in_RDI + 0x10) + 1;
  *(size_type *)(in_RDI + 0x10) = sVar1;
  this_00 = std::
            __shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x125bc8);
  sVar2 = std::
          vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
          ::size(this_00);
  if (sVar1 == sVar2) {
    std::
    __shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::reset(unaff_retaddr);
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

void increment()
  {
    if (++index_ == values_->size())
    {
      // Reset state to match a default constructed end iterator.
      values_.reset();
      index_ = 0;
    }
  }